

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

QDebug * __thiscall QDebug::operator<<(QDebug *this,QString *t)

{
  QDebug *pQVar1;
  QString *in_RSI;
  QChar *in_RDI;
  
  pQVar1 = (QDebug *)QString::constData((QString *)0x115626);
  QString::size(in_RSI);
  ::QDebug::putString(in_RDI,(ulong)pQVar1);
  pQVar1 = maybeSpace(pQVar1);
  return pQVar1;
}

Assistant:

inline QDebug &operator<<(const QString & t) { putString(t.constData(), size_t(t.size())); return maybeSpace(); }